

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_30::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  ForkedPromise<void> *other;
  Promise<void> *pPVar1;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar3;
  undefined1 local_60 [8];
  Promise<void> result;
  ForkedPromise<void> fork;
  ForkedPromise<void> *p;
  AsyncStreamFd *this_local;
  PromiseNode *pPVar2;
  
  fork.hub.ptr = (ForkHub<kj::_::Void> *)
                 kj::_::readMaybe<kj::ForkedPromise<void>>
                           ((Maybe<kj::ForkedPromise<void>_> *)(in_RSI + 0x78));
  if (fork.hub.ptr == (ForkHub<kj::_::Void> *)0x0) {
    UnixEventPort::FdObserver::whenWriteDisconnected((FdObserver *)&stack0xffffffffffffffc0);
    Promise<void>::fork((Promise<void> *)&stack0xffffffffffffffd0);
    Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffc0);
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_60);
    other = mv<kj::ForkedPromise<void>>((ForkedPromise<void> *)&stack0xffffffffffffffd0);
    Maybe<kj::ForkedPromise<void>_>::operator=
              ((Maybe<kj::ForkedPromise<void>_> *)(in_RSI + 0x78),other);
    pPVar1 = mv<kj::Promise<void>>((Promise<void> *)local_60);
    Promise<void>::Promise((Promise<void> *)this,pPVar1);
    Promise<void>::~Promise((Promise<void> *)local_60);
    ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)&stack0xffffffffffffffd0);
    pPVar2 = extraout_RDX;
  }
  else {
    PVar3 = ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
    pPVar2 = PVar3.super_PromiseBase.node.ptr;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_MAYBE(p, writeDisconnectedPromise) {
      return p->addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }